

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_linear_resampler_interpolate_frame_s16(ma_linear_resampler *pResampler,ma_int16 *pFrameOut)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar1 = (pResampler->config).channels;
  uVar5 = 0;
  uVar4 = (pResampler->inTimeFrac << 0xc) / (pResampler->config).sampleRateOut;
  pfVar2 = (pResampler->x0).f32;
  pfVar3 = (pResampler->x1).f32;
  do {
    pFrameOut[uVar5] =
         (ma_int16)
         ((int)*(short *)((long)pfVar3 + uVar5 * 2) * uVar4 +
          (int)*(short *)((long)pfVar2 + uVar5 * 2) * (0x1000 - uVar4) >> 0xc);
    uVar5 = uVar5 + 1;
  } while (uVar1 != uVar5);
  return;
}

Assistant:

static void ma_linear_resampler_interpolate_frame_s16(ma_linear_resampler* pResampler, ma_int16* MA_RESTRICT pFrameOut)
{
    ma_uint32 c;
    ma_uint32 a;
    const ma_uint32 channels = pResampler->config.channels;
    const ma_uint32 shift = 12;

    MA_ASSERT(pResampler != NULL);
    MA_ASSERT(pFrameOut  != NULL);

    a = (pResampler->inTimeFrac << shift) / pResampler->config.sampleRateOut;

    MA_ASSUME(channels > 0);
    for (c = 0; c < channels; c += 1) {
        ma_int16 s = ma_linear_resampler_mix_s16(pResampler->x0.s16[c], pResampler->x1.s16[c], a, shift);
        pFrameOut[c] = s;
    }
}